

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O3

void __thiscall SimpleLoggerMgr::flushAllLoggers(SimpleLoggerMgr *this,int level,string *msg)

{
  _Hash_node_base *p_Var1;
  SimpleLogger *this_00;
  unique_lock<std::mutex> l;
  unique_lock<std::mutex> local_40;
  
  local_40._M_owns = false;
  local_40._M_device = &this->loggersLock;
  std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  for (p_Var1 = (this->loggers)._M_h._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0;
      p_Var1 = p_Var1->_M_nxt) {
    this_00 = (SimpleLogger *)p_Var1[1]._M_nxt;
    if (this_00 != (SimpleLogger *)0x0) {
      if (msg->_M_string_length != 0) {
        SimpleLogger::put(this_00,level,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/greensky00[P]simple_logger/src/logger.cc"
                          ,"flushAllLoggers",0x28d,"%s",(msg->_M_dataplus)._M_p);
      }
      SimpleLogger::flush(this_00,(this_00->cursor).super___atomic_base<unsigned_long>._M_i);
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
  return;
}

Assistant:

void SimpleLoggerMgr::flushAllLoggers(int level, const std::string& msg) {
    std::unique_lock<std::mutex> l(loggersLock);
    for (auto& entry: loggers) {
        SimpleLogger* logger = entry;
        if (!logger) continue;
        if (!msg.empty()) {
            logger->put(level, __FILE__, __func__, __LINE__, "%s", msg.c_str());
        }
        logger->flushAll();
    }
}